

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  VP8StatusCode VVar1;
  VP8LDecoder *pVVar2;
  int iVar3;
  int iVar4;
  ALPHDecoder *pAVar5;
  int in_ECX;
  int in_EDX;
  VP8Decoder *in_RSI;
  VP8Decoder *in_RDI;
  uint8_t *unaff_retaddr;
  ALPHDecoder *in_stack_00000008;
  uint8_t *alpha;
  VP8LDecoder *vp8l_dec;
  int height;
  int width;
  VP8StatusCode local_44;
  VP8Io *in_stack_ffffffffffffffc0;
  VP8Decoder *in_stack_ffffffffffffffc8;
  size_t in_stack_fffffffffffffff8;
  
  VVar1 = in_RSI->status_;
  iVar4 = (in_RSI->segment_hdr_).use_segment_;
  if (((in_EDX < 0) || (in_ECX < 1)) || (iVar4 < in_EDX + in_ECX)) {
    return (uint8_t *)0x0;
  }
  if (in_RDI->is_alpha_decoded_ == 0) {
    if (in_RDI->alph_dec_ == (ALPHDecoder *)0x0) {
      pAVar5 = ALPHNew();
      in_RDI->alph_dec_ = pAVar5;
      if (in_RDI->alph_dec_ == (ALPHDecoder *)0x0) {
        VP8SetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
        return (uint8_t *)0x0;
      }
      iVar3 = AllocateAlphaPlane(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      if (iVar3 == 0) goto LAB_0011c185;
      iVar3 = ALPHInit(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,(VP8Io *)in_RDI,
                       (uint8_t *)in_RSI);
      if (iVar3 == 0) {
        pVVar2 = in_RDI->alph_dec_->vp8l_dec_;
        if (pVVar2 == (VP8LDecoder *)0x0) {
          local_44 = VP8_STATUS_OUT_OF_MEMORY;
        }
        else {
          local_44 = pVVar2->status_;
        }
        VP8SetError(in_RDI,local_44,"Alpha decoder initialization failed.");
        goto LAB_0011c185;
      }
      if (in_RDI->alph_dec_->pre_processing_ == 1) {
        in_ECX = iVar4 - in_EDX;
      }
      else {
        in_RDI->alpha_dithering_ = 0;
      }
    }
    iVar4 = ALPHDecode(in_RSI,in_EDX,in_ECX);
    if (iVar4 == 0) {
LAB_0011c185:
      WebPDeallocateAlphaMemory((VP8Decoder *)0x11c18f);
      return (uint8_t *)0x0;
    }
    if (in_RDI->is_alpha_decoded_ != 0) {
      ALPHDelete((ALPHDecoder *)0x11c0c5);
      in_RDI->alph_dec_ = (ALPHDecoder *)0x0;
      if ((0 < in_RDI->alpha_dithering_) &&
         (iVar4 = WebPDequantizeLevels((uint8_t *)dec,io._4_4_,(int)io,row,num_rows), iVar4 == 0))
      goto LAB_0011c185;
    }
  }
  return in_RDI->alpha_plane_ + (int)(in_EDX * VVar1);
}

Assistant:

WEBP_NODISCARD const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                                     const VP8Io* const io,
                                                     int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded_) {
    if (dec->alph_dec_ == NULL) {    // Initialize decoder.
      dec->alph_dec_ = ALPHNew();
      if (dec->alph_dec_ == NULL) {
        VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                    "Alpha decoder initialization failed.");
        return NULL;
      }
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec_, dec->alpha_data_, dec->alpha_data_size_,
                    io, dec->alpha_plane_)) {
        VP8LDecoder* const vp8l_dec = dec->alph_dec_->vp8l_dec_;
        VP8SetError(dec,
                    (vp8l_dec == NULL) ? VP8_STATUS_OUT_OF_MEMORY
                                       : vp8l_dec->status_,
                    "Alpha decoder initialization failed.");
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec_->pre_processing_ != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering_ = 0;   // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec_ != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded_) {   // finished?
      ALPHDelete(dec->alph_dec_);
      dec->alph_dec_ = NULL;
      if (dec->alpha_dithering_ > 0) {
        uint8_t* const alpha = dec->alpha_plane_ + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering_)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane_ + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}